

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.cpp
# Opt level: O0

optional<n_e_s::core::Pixel> __thiscall n_e_s::nes::Nes::execute(Nes *this)

{
  ulong uVar1;
  undefined2 extraout_var;
  optional<n_e_s::core::Pixel> oVar2;
  pointer pIVar3;
  pointer pIVar4;
  Nes *this_local;
  
  uVar1 = this->cycle_;
  this->cycle_ = uVar1 + 1;
  if (uVar1 % 0xc == 0) {
    pIVar3 = std::unique_ptr<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>::
             operator->(&this->cpu_);
    (*(pIVar3->super_ICpu)._vptr_ICpu[2])();
  }
  if ((this->cycle_ & 3) == 0) {
    pIVar4 = std::unique_ptr<n_e_s::core::IPpu,_std::default_delete<n_e_s::core::IPpu>_>::operator->
                       (&this->ppu_);
    this_local._2_4_ = (*pIVar4->_vptr_IPpu[4])();
    this_local._6_2_ = extraout_var;
  }
  else {
    std::optional<n_e_s::core::Pixel>::optional
              ((optional<n_e_s::core::Pixel> *)((long)&this_local + 2));
  }
  oVar2.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Pixel>._4_2_ = this_local._6_2_;
  oVar2.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._0_4_ = this_local._2_4_;
  return (optional<n_e_s::core::Pixel>)
         oVar2.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
         super__Optional_payload_base<n_e_s::core::Pixel>;
}

Assistant:

std::optional<core::Pixel> Nes::execute() {
    if (cycle_++ % 12 == 0) {
        cpu_->execute();
    }

    if (cycle_ % 4 == 0) {
        return ppu_->execute();
    }

    // The APU runs at master clock % 24. (every other CPU tick)
    return {};
}